

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFront.c
# Opt level: O2

Gia_Man_t * Gia_ManFront(Gia_Man_t *p)

{
  char *pcVar1;
  uint *puVar2;
  Vec_Int_t *pVVar3;
  undefined8 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Gia_Man_t *p_00;
  char *pcVar9;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  ulong uVar12;
  Gia_Obj_t *pGVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  bool bVar19;
  uint local_5c;
  
  uVar5 = Gia_ManCrossCutSimple(p);
  Gia_ManCreateValueRefs(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar9 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar9;
  pcVar9 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar9;
  iVar14 = (int)((float)(int)uVar5 * 1.1) + 1;
  p_00->nFront = iVar14;
  pcVar9 = (char *)calloc((long)iVar14,1);
  uVar16 = 0;
  local_5c = Gia_ManFrontFindNext(pcVar9,iVar14,0);
  p_00->pObjs->Value = local_5c;
  iVar14 = 1;
  bVar19 = p->pObjs->Value == 0;
  if (bVar19) {
    pcVar9[(int)local_5c] = '\0';
  }
  uVar17 = (uint)!bVar19;
  do {
    iVar6 = p->nObjs;
    if (iVar6 <= iVar14) {
LAB_0059db8a:
      if (p_00->nObjs != iVar6) {
        __assert_fail("pNew->nObjs == p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                      ,0xf0,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      if ((uVar17 != 0) && (uVar16 != uVar5)) {
        __assert_fail("nCrossCut == 0 || nCrossCutMax == nCrossCutMaxInit",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                      ,0xf1,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      uVar15 = 0;
      uVar12 = (ulong)(uint)p_00->nFront;
      if (p_00->nFront < 1) {
        uVar12 = uVar15;
      }
      do {
        if (uVar12 == uVar15) {
          free(pcVar9);
          Gia_ManSetRegNum(p_00,p->nRegs);
          return p_00;
        }
        pcVar1 = pcVar9 + uVar15;
        uVar15 = uVar15 + 1;
      } while (*pcVar1 == '\0');
      __assert_fail("pFront[i] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                    ,0xf3,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
    }
    pObj = Gia_ManObj(p,iVar14);
    if (pObj == (Gia_Obj_t *)0x0) {
      iVar6 = p->nObjs;
      goto LAB_0059db8a;
    }
    uVar8 = (uint)*(undefined8 *)pObj;
    if ((uVar8 & 0x9fffffff) == 0x9fffffff) {
      uVar8 = uVar17 + 1;
      if ((int)uVar17 < (int)uVar16) {
        uVar8 = uVar16;
      }
      uVar18 = uVar17 + 1;
      if (pObj->Value == 0) {
        uVar8 = uVar16;
        uVar18 = uVar17;
      }
      uVar16 = uVar8;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pVVar3 = p_00->vCis;
      iVar6 = Gia_ObjId(p_00,pGVar10);
      Vec_IntPush(pVVar3,iVar6);
      iVar6 = Gia_ObjId(p_00,pGVar10);
      iVar6 = Abc_Lit2Var(iVar6 * 2);
      pGVar10 = Gia_ManObj(p_00,iVar6);
      iVar6 = Gia_ObjId(p_00,pGVar10);
      iVar7 = Gia_ObjId(p,pObj);
      if (iVar6 != iVar7) {
        __assert_fail("Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                      ,0xb4,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      local_5c = Gia_ManFrontFindNext(pcVar9,p_00->nFront,local_5c);
      pGVar10->Value = local_5c;
      uVar17 = uVar18;
      if (pObj->Value == 0) {
        pcVar9[(int)local_5c] = '\0';
      }
    }
    else if ((~uVar8 & 0x1fffffff) == 0 || -1 < (int)uVar8) {
      uVar8 = uVar17 + 1;
      if ((int)uVar17 < (int)uVar16) {
        uVar8 = uVar16;
      }
      uVar18 = uVar17 + 1;
      if (pObj->Value == 0) {
        uVar8 = uVar16;
        uVar18 = uVar17;
      }
      uVar16 = uVar8;
      pGVar10 = Gia_ManAppendObj(p_00);
      iVar6 = Gia_ObjId(p_00,pGVar10);
      iVar7 = Gia_ObjId(p,pObj);
      if (iVar6 != iVar7) {
        __assert_fail("Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                      ,0xd4,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      pGVar11 = Gia_ManObj(p_00,iVar14 - (*(uint *)pObj & 0x1fffffff));
      if ((ulong)pGVar11->Value == 0x1fffffff) {
        __assert_fail("pFanin0New->Value != GIA_NONE",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                      ,0xd7,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      uVar12 = (ulong)pGVar11->Value & 0x1fffffff;
      uVar15 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar15 & 0xffffffffe0000000 | uVar12;
      *(ulong *)pGVar10 =
           uVar15 & 0xffffffffc0000000 | uVar12 | (ulong)((uint)*(undefined8 *)pObj & 0x20000000);
      pGVar13 = Gia_ManObj(p_00,iVar14 - (*(uint *)&pObj->field_0x4 & 0x1fffffff));
      if (pGVar13->Value == 0x1fffffff) {
        __assert_fail("pFanin1New->Value != GIA_NONE",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                      ,0xdc,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      uVar12 = (ulong)(pGVar13->Value & 0x1fffffff) << 0x20;
      uVar15 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar15 & 0xe0000000ffffffff | uVar12;
      *(ulong *)pGVar10 = uVar15 & 0xc0000000ffffffff | uVar12 | *(ulong *)pObj & 0x2000000000000000
      ;
      local_5c = Gia_ManFrontFindNext(pcVar9,p_00->nFront,local_5c);
      pGVar10->Value = local_5c;
      uVar4 = *(undefined8 *)pObj;
      puVar2 = &pObj[-(ulong)((uint)uVar4 & 0x1fffffff)].Value;
      *puVar2 = *puVar2 - 1;
      if (*puVar2 == 0) {
        pcVar9[pGVar11->Value] = '\0';
        uVar18 = uVar18 - 1;
      }
      puVar2 = &pObj[-(ulong)((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff)].Value;
      *puVar2 = *puVar2 - 1;
      if (*puVar2 == 0) {
        pcVar9[pGVar13->Value] = '\0';
        uVar18 = uVar18 - 1;
      }
      uVar17 = uVar18;
      if (pObj->Value == 0) {
        pcVar9[(int)local_5c] = '\0';
      }
    }
    else {
      if (pObj->Value != 0) {
        __assert_fail("Gia_ObjValue(pObj) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                      ,0xbd,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      if (p_00->nObjs < 1) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x2ec,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar10 = Gia_ManObj(p_00,0);
      if ((~*(uint *)pGVar10 & 0x1fffffff) != 0 && (int)*(uint *)pGVar10 < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x2ed,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar10 = Gia_ManAppendObj(p_00);
      *(ulong *)pGVar10 = *(ulong *)pGVar10 | 0x80000000;
      uVar8 = Gia_ObjId(p_00,pGVar10);
      uVar15 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar15 & 0xffffffffc0000000 | (ulong)(uVar8 & 0x1fffffff);
      *(ulong *)pGVar10 =
           uVar15 & 0xe0000000c0000000 | (ulong)(uVar8 & 0x1fffffff) |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pVVar3 = p_00->vCos;
      iVar6 = Gia_ObjId(p_00,pGVar10);
      Vec_IntPush(pVVar3,iVar6);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff),pGVar10)
        ;
      }
      iVar6 = Gia_ObjId(p_00,pGVar10);
      iVar6 = Abc_Lit2Var(iVar6 * 2);
      pGVar10 = Gia_ManObj(p_00,iVar6);
      iVar6 = Gia_ObjId(p_00,pGVar10);
      iVar7 = Gia_ObjId(p,pObj);
      if (iVar6 != iVar7) {
        __assert_fail("Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                      ,0xc1,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      pGVar11 = Gia_ManObj(p_00,iVar14 - (*(uint *)pObj & 0x1fffffff));
      if (pGVar11->Value == 0x1fffffff) {
        __assert_fail("pFanin0New->Value != GIA_NONE",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFront.c"
                      ,0xc4,"Gia_Man_t *Gia_ManFront(Gia_Man_t *)");
      }
      pGVar10->Value = 0x1fffffff;
      uVar12 = (ulong)pGVar11->Value & 0x1fffffff;
      uVar15 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar15 & 0xffffffffe0000000 | uVar12;
      *(ulong *)pGVar10 =
           uVar15 & 0xffffffffc0000000 | uVar12 | (ulong)((uint)*(undefined8 *)pObj & 0x20000000);
      puVar2 = &pObj[-(*(ulong *)pObj & 0x1fffffff)].Value;
      *puVar2 = *puVar2 - 1;
      if (*puVar2 == 0) {
        pcVar9[pGVar11->Value] = '\0';
        uVar17 = uVar17 - 1;
      }
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManFront( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pFanin0New, * pFanin1New, * pObjNew;
    char * pFront;    // places used for the frontier
    int i, iLit, nCrossCut = 0, nCrossCutMax = 0;
    int nCrossCutMaxInit = Gia_ManCrossCutSimple( p );
    int iFront = 0;//, clk = Abc_Clock(); 
    // set references for all objects
    Gia_ManCreateValueRefs( p );
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nFront = 1 + (int)((float)1.1 * nCrossCutMaxInit); 
    // start the frontier
    pFront = ABC_CALLOC( char, pNew->nFront );
    // add constant node
    Gia_ManConst0(pNew)->Value = iFront = Gia_ManFrontFindNext( pFront, pNew->nFront, iFront );
    if ( Gia_ObjValue(Gia_ManConst0(p)) == 0 )
        pFront[iFront] = 0;
    else
        nCrossCut = 1;
    // iterate through the objects
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
        {
            if ( Gia_ObjValue(pObj) && nCrossCutMax < ++nCrossCut )
                nCrossCutMax = nCrossCut;
            // create new node
            iLit = Gia_ManAppendCi( pNew );
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(iLit) );
            assert( Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj) );
            pObjNew->Value = iFront = Gia_ManFrontFindNext( pFront, pNew->nFront, iFront );
            // handle CIs without fanout
            if ( Gia_ObjValue(pObj) == 0 )
                pFront[iFront] = 0;
            continue;
        }
        if ( Gia_ObjIsCo(pObj) )
        {
            assert( Gia_ObjValue(pObj) == 0 );
            // create new node
            iLit = Gia_ManAppendCo( pNew, 0 );
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(iLit) );
            assert( Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj) );
            // get the fanin
            pFanin0New = Gia_ManObj( pNew, Gia_ObjFaninId0(pObj, i) );
            assert( pFanin0New->Value != GIA_NONE );
            pObjNew->Value = GIA_NONE;
            pObjNew->iDiff0 = pFanin0New->Value;
            pObjNew->fCompl0 = Gia_ObjFaninC0(pObj);
            // deref the fanin
            if ( --Gia_ObjFanin0(pObj)->Value == 0 )
            {
                pFront[pFanin0New->Value] = 0;
                nCrossCut--;
            }
            continue;
        }
        if ( Gia_ObjValue(pObj) && nCrossCutMax < ++nCrossCut )
            nCrossCutMax = nCrossCut;
        // create new node
        pObjNew = Gia_ManAppendObj( pNew );
        assert( Gia_ObjId(pNew, pObjNew) == Gia_ObjId(p, pObj) );
        // assign the first fanin
        pFanin0New = Gia_ManObj( pNew, Gia_ObjFaninId0(pObj, i) );
        assert( pFanin0New->Value != GIA_NONE );
        pObjNew->iDiff0 = pFanin0New->Value;
        pObjNew->fCompl0 = Gia_ObjFaninC0(pObj);
        // assign the second fanin
        pFanin1New = Gia_ManObj( pNew, Gia_ObjFaninId1(pObj, i) );
        assert( pFanin1New->Value != GIA_NONE );
        pObjNew->iDiff1 = pFanin1New->Value;
        pObjNew->fCompl1 = Gia_ObjFaninC1(pObj);
        // assign the frontier number
        pObjNew->Value = iFront = Gia_ManFrontFindNext( pFront, pNew->nFront, iFront );
        // deref the fanins
        if ( --Gia_ObjFanin0(pObj)->Value == 0 )
        {
            pFront[pFanin0New->Value] = 0;
            nCrossCut--;
        }
        if ( --Gia_ObjFanin1(pObj)->Value == 0 )
        {
            pFront[pFanin1New->Value] = 0;
            nCrossCut--;
        }
        // handle nodes without fanout (choice nodes)
        if ( Gia_ObjValue(pObj) == 0 )
            pFront[iFront] = 0;
    }
    assert( pNew->nObjs == p->nObjs );
    assert( nCrossCut == 0 || nCrossCutMax == nCrossCutMaxInit );
    for ( i = 0; i < pNew->nFront; i++ )
        assert( pFront[i] == 0 );
    ABC_FREE( pFront );
//printf( "Crosscut = %6d. Frontier = %6d. ", nCrossCutMaxInit, pNew->nFront );
//ABC_PRT( "Time", Abc_Clock() - clk );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}